

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O2

bool mocker::detail::runOptPassImpl<mocker::LocalValueNumbering>
               (Module *module,BasicBlockPass *param_2)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  __node_base *p_Var4;
  LocalValueNumbering LStack_88;
  
  p_Var4 = &(module->funcs)._M_h._M_before_begin;
  bVar2 = false;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (*(char *)&p_Var4[0x11]._M_nxt == '\0') {
      p_Var3 = p_Var4 + 0xc;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != p_Var4 + 0xc) {
        LocalValueNumbering::LocalValueNumbering(&LStack_88,(BasicBlock *)(p_Var3 + 2));
        bVar1 = LocalValueNumbering::operator()(&LStack_88);
        bVar2 = (bool)(bVar2 | bVar1);
        LocalValueNumbering::~LocalValueNumbering(&LStack_88);
      }
    }
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, BasicBlockPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    for (auto &bb : func.second.getMutableBBs()) {
      res |= Pass{bb, std::forward<Args>(args)...}();
    }
  }
  return res;
}